

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O1

void __thiscall
soplex::SVSetBase<double>::add<double>(SVSetBase<double> *this,SVSetBase<double> *pset)

{
  Item *pIVar1;
  Item *pIVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  Nonzero<double> *pNVar6;
  Nonzero<double> *pNVar7;
  long lVar8;
  
  iVar3 = (pset->set).thenum;
  lVar8 = (long)iVar3;
  if (lVar8 < 1) {
    iVar5 = 0;
  }
  else {
    lVar4 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + (pset->set).theitem[(pset->set).thekey[lVar4].idx].data.
                      super_SVectorBase<double>.memused;
      lVar4 = lVar4 + 1;
    } while (lVar8 != lVar4);
  }
  ensurePSVec(this,iVar3);
  ensureMem(this,iVar5,true);
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      pIVar1 = (pset->set).theitem + (pset->set).thekey[lVar4].idx;
      pIVar2 = (Item *)create(this,(pIVar1->data).super_SVectorBase<double>.memused);
      if (pIVar2 != pIVar1) {
        iVar3 = (pIVar1->data).super_SVectorBase<double>.memused;
        if (iVar3 == 0) {
          iVar5 = 0;
        }
        else {
          pNVar6 = (pIVar1->data).super_SVectorBase<double>.m_elem;
          pNVar7 = (pIVar2->data).super_SVectorBase<double>.m_elem;
          iVar5 = 0;
          do {
            if ((pNVar6->val != 0.0) || (NAN(pNVar6->val))) {
              pNVar7->idx = pNVar6->idx;
              pNVar7->val = pNVar6->val;
              pNVar7 = pNVar7 + 1;
              iVar5 = iVar5 + 1;
            }
            iVar3 = iVar3 + -1;
            pNVar6 = pNVar6 + 1;
          } while (iVar3 != 0);
        }
        (pIVar2->data).super_SVectorBase<double>.memused = iVar5;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar8);
  }
  return;
}

Assistant:

void add(const SVSetBase<S>& pset)
   {
      int i;
      int n;
      int len;

      n = pset.num();

      for(i = len = 0; i < n; ++i)
         len += pset[i].size();

      ensurePSVec(n);
      ensureMem(len);

      for(i = 0; i < n; ++i)
         *create(pset[i].size()) = pset[i];
   }